

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_UInt32 * FT_Face_GetCharsOfVariant(FT_Face face,FT_ULong variantSelector)

{
  FT_CharMap pFVar1;
  FT_Memory memory;
  FT_CMap_conflict vcmap;
  FT_CharMap charmap;
  FT_UInt32 *result;
  FT_ULong variantSelector_local;
  FT_Face face_local;
  
  charmap = (FT_CharMap)0x0;
  if ((face != (FT_Face)0x0) &&
     (pFVar1 = find_variant_selector_charmap(face), pFVar1 != (FT_CharMap)0x0)) {
    charmap = (FT_CharMap)
              (**(code **)&(pFVar1[1].face)->num_charmaps)
                        (pFVar1,face->memory,variantSelector & 0xffffffff);
  }
  return (FT_UInt32 *)charmap;
}

Assistant:

FT_EXPORT_DEF( FT_UInt32* )
  FT_Face_GetCharsOfVariant( FT_Face   face,
                             FT_ULong  variantSelector )
  {
    FT_UInt32  *result = NULL;


    if ( face )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );


      if ( charmap )
      {
        FT_CMap    vcmap  = FT_CMAP( charmap );
        FT_Memory  memory = FT_FACE_MEMORY( face );


        if ( variantSelector > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Get_Char_Index: too large variantSelector" ));
          FT_TRACE1(( " 0x%lx is truncated\n", variantSelector ));
        }

        result = vcmap->clazz->variantchar_list( vcmap, memory,
                                                 (FT_UInt32)variantSelector );
      }
    }

    return result;
  }